

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_gfx_vertex3f(float x,float y,float z)

{
  int *piVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_vertex_data_type *prVar5;
  long lVar6;
  long in_FS_OFFSET;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if ((rf__ctx->field_0).transform_matrix_required == true) {
    fVar7 = (rf__ctx->field_0).transform.m8 * z;
    fVar9 = (rf__ctx->field_0).transform.m1 * x;
    fVar8 = (rf__ctx->field_0).transform.m9 * z;
    z = z * (rf__ctx->field_0).transform.m10 +
        x * (rf__ctx->field_0).transform.m2 + y * (rf__ctx->field_0).transform.m6 +
        (rf__ctx->field_0).transform.m14;
    x = fVar7 + (rf__ctx->field_0).transform.m0 * x + (rf__ctx->field_0).transform.m4 * y +
        (rf__ctx->field_0).transform.m12;
    y = fVar8 + fVar9 + (rf__ctx->field_0).transform.m5 * y + (rf__ctx->field_0).transform.m13;
  }
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  lVar6 = (long)prVar4[lVar3].v_counter;
  if (prVar4[lVar3].elements_count * 4 <= prVar4[lVar3].v_counter) {
    rf_log_impl(8,0x17dfbe,(char *)0x6);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_gfx_vertex3f";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x9ba5;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 6;
    return;
  }
  prVar5 = prVar4[lVar3].vertices;
  prVar5[lVar6 * 3] = x;
  prVar5[lVar6 * 3 + 1] = y;
  prVar5[lVar6 * 3 + 2] = z;
  prVar4[lVar3].v_counter = prVar4[lVar3].v_counter + 1;
  piVar1 = &prVar2->draw_calls[prVar2->draw_calls_counter + -1].vertex_count;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

RF_API void rf_gfx_vertex3f(float x, float y, float z)
{
    rf_vec3 vec = {x, y, z };

    // rf_transform provided vector if required
    if (rf_ctx.transform_matrix_required) vec = rf_vec3_transform(vec, rf_ctx.transform);

    // Verify that rf_max_batch_elements limit not reached
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter < (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4))
    {
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter] = vec.x;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 1] = vec.y;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 2] = vec.z;
        rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter++;

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count++;
    }
    else RF_LOG_ERROR(RF_LIMIT_REACHED, "Render batch elements limit reached. Max bacht elements: %d", rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4);
}